

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int pager_journal_rollback(Pager *pPager,int check_hot)

{
  unqlite_file **ppOut;
  unqlite_vfs *puVar1;
  unqlite_file *pChunk;
  SyMemBackend *pBackend;
  sxu32 cksum;
  int iVar2;
  sxi32 sVar3;
  sxu32 sVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  sxu32 sVar10;
  int *piVar11;
  sxu32 iSectorSize;
  int exists;
  uchar zMagic [8];
  int locked;
  sxu32 local_6c;
  undefined1 *local_68;
  pgno local_60;
  sxu32 local_58;
  undefined4 uStack_54;
  sxu64 local_50;
  sxu32 local_44;
  long local_40;
  sxu32 local_38;
  sxu32 local_34;
  
  if (check_hot != 0) {
    puVar1 = pPager->pVfs;
    local_58 = 1;
    local_6c = 0;
    iVar2 = (*puVar1->xAccess)(puVar1,pPager->zJournal,0,(int *)&local_58);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (local_58 == 0) {
      return 0;
    }
    local_44 = 0;
    iVar2 = (*pPager->pfd->pMethods->xCheckReservedLock)(pPager->pfd,(int *)&local_44);
    if (local_44 != 0 || iVar2 != 0) {
      return iVar2;
    }
    local_50 = 0;
    iVar2 = (*pPager->pfd->pMethods->xFileSize)(pPager->pfd,(unqlite_int64 *)&local_50);
    if (iVar2 != 0) {
      return iVar2;
    }
    if ((long)local_50 < 1) {
      iVar2 = pager_lock_db(pPager,2);
      if (iVar2 != 0) {
        return 0;
      }
      (*puVar1->xDelete)(puVar1,pPager->zJournal,0);
      if (pPager->iLock == 0) {
        return 0;
      }
      piVar11 = &pPager->iLock;
      (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
    }
    else {
      piVar11 = (int *)&local_6c;
    }
    *piVar11 = 1;
    if (local_6c == 0) {
      return 0;
    }
  }
  if (pPager->is_rdonly != 0) {
    unqliteGenErrorFormat
              (pPager->pDb,"Cannot rollback journal file \'%s\' due to a read-only database handle",
               pPager->zJournal);
    return -0x4b;
  }
  ppOut = &pPager->pjfd;
  iVar2 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,ppOut,2);
  if (iVar2 != 0) {
    unqliteGenErrorFormat
              (pPager->pDb,"IO error while opening journal file: \'%s\'",pPager->zJournal);
    goto LAB_00116c07;
  }
  iVar2 = pager_lock_db(pPager,4);
  if (iVar2 != 0) {
    unqliteGenError(pPager->pDb,
                    "Cannot acquire an exclusive lock on the database while journal rollback");
    goto LAB_00116c07;
  }
  (*pPager->pjfd->pMethods->xSync)(pPager->pjfd,2);
  iVar2 = (*pPager->pjfd->pMethods->xFileSize)(pPager->pjfd,(unqlite_int64 *)&local_58);
  if ((iVar2 == 0) && (0x1f < CONCAT44(uStack_54,local_58))) {
    iVar2 = (*(*ppOut)->pMethods->xRead)(*ppOut,&local_50,8,0);
    if (iVar2 != 0) goto LAB_00116baa;
    sVar3 = SyMemcmp(&local_50,aJournalMagic,8);
    if (sVar3 != 0) goto LAB_00116be3;
    iVar2 = ReadInt32(*ppOut,&local_34,8);
    if ((iVar2 == 0) && (iVar2 = ReadInt32(pPager->pjfd,&pPager->cksumInit,0xc), iVar2 == 0)) {
      iVar2 = ReadInt64(*ppOut,&pPager->dbSize,0x10);
      if ((iVar2 != 0) ||
         ((iVar2 = ReadInt32(*ppOut,&local_6c,0x18), iVar2 != 0 ||
          (iVar2 = ReadInt32(*ppOut,&local_44,0x1c), iVar2 != 0)))) goto LAB_00116baa;
      if (((local_6c - 0x10001 < 0xffff001f || local_44 - 0x10001 < 0xffff01ff) ||
          ((local_44 + 0x1ffff & local_44) != 0)) || ((local_6c + 0x1ffff & local_6c) != 0))
      goto LAB_00116be3;
      pPager->iSectorSize = local_6c;
      pPager->iPageSize = local_44;
      pPager->iJournalOfft = (ulong)local_6c;
      iVar2 = (*pPager->pfd->pMethods->xTruncate)(pPager->pfd,pPager->dbSize * (ulong)local_44);
      if (iVar2 == 0) {
        local_68 = (undefined1 *)SyMemBackendAlloc(pPager->pAllocator,pPager->iPageSize);
        if (local_68 != (undefined1 *)0x0) {
          if ((ulong)(uint)pPager->iPageSize != 0) {
            puVar5 = local_68 + (uint)pPager->iPageSize;
            puVar6 = local_68;
            do {
              *puVar6 = 0;
              if (puVar5 <= puVar6 + 1) break;
              puVar6[1] = 0;
              if (puVar5 <= puVar6 + 2) break;
              puVar6[2] = 0;
              if (puVar5 <= puVar6 + 3) break;
              puVar6[3] = 0;
              puVar6 = puVar6 + 4;
            } while (puVar6 < puVar5);
          }
          local_38 = local_34;
          if (local_34 == 0) {
            SyMemBackendFree(pPager->pAllocator,local_68);
          }
          else {
            local_60 = pPager->iJournalOfft;
            sVar10 = 0;
            do {
              iVar2 = ReadInt64(*ppOut,&local_50,local_60);
              if (iVar2 == 0) {
                lVar8 = local_60 + 8;
                iVar2 = (*pPager->pjfd->pMethods->xRead)
                                  (pPager->pjfd,local_68,(long)pPager->iPageSize,lVar8);
                if (iVar2 != 0) goto LAB_00116e4a;
                local_40 = lVar8 + pPager->iPageSize;
                iVar2 = ReadInt32(pPager->pjfd,&local_58,local_40);
                if (iVar2 != 0) goto LAB_00116e4a;
                sVar4 = pPager->cksumInit;
                lVar8 = (long)pPager->iPageSize;
                if (200 < lVar8) {
                  uVar7 = lVar8 + 200;
                  do {
                    sVar4 = sVar4 + (byte)local_68[uVar7 - 400];
                    uVar7 = uVar7 - 200;
                  } while (400 < uVar7);
                }
                local_40 = local_40 + 4;
                iVar9 = -0x3f;
                if (local_58 == sVar4) {
                  iVar9 = 0;
                  local_60 = local_50;
                  if (local_50 < pPager->dbSize) {
                    iVar2 = (*pPager->pfd->pMethods->xWrite)
                                      (pPager->pfd,local_68,lVar8,local_50 * lVar8);
                    if (iVar2 != 0) {
                      local_60 = local_40;
                      goto LAB_00116e4a;
                    }
                    pager_fill_page(pPager,local_60,local_68);
                  }
                }
                local_60 = local_40;
              }
              else {
LAB_00116e4a:
                iVar9 = -0x3f;
                if (iVar2 != -0x3f) {
                  unqliteGenError(pPager->pDb,"Page playback error");
                  SyMemBackendFree(pPager->pAllocator,local_68);
                  if (iVar2 != -0x1c) goto LAB_00116be5;
                  goto LAB_00116be3;
                }
              }
              iVar2 = iVar9;
              sVar10 = sVar10 + 1;
            } while (sVar10 != local_38);
            SyMemBackendFree(pPager->pAllocator,local_68);
            if (iVar2 != 0) goto LAB_00116be5;
          }
          (*pPager->pfd->pMethods->xSync)(pPager->pfd,3);
          goto LAB_00116be3;
        }
        unqliteGenError(pPager->pDb,"unQLite is running out of memory");
        iVar2 = -1;
      }
      else {
        unqliteGenError(pPager->pDb,"IO error while truncating database file");
      }
    }
    else {
LAB_00116baa:
      if (iVar2 == -0x1c) goto LAB_00116be3;
      unqliteGenErrorFormat
                (pPager->pDb,"IO error while reading journal file \'%s\' header",pPager->zJournal);
    }
  }
  else {
LAB_00116be3:
    iVar2 = 0;
  }
LAB_00116be5:
  if (pPager->iLock != 0) {
    (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
    pPager->iLock = 1;
  }
LAB_00116c07:
  pChunk = *ppOut;
  if (pChunk != (unqlite_file *)0x0) {
    pBackend = pPager->pAllocator;
    (*pChunk->pMethods->xClose)(pChunk);
    SyMemBackendFree(pBackend,pChunk);
  }
  *ppOut = (unqlite_file *)0x0;
  if (iVar2 == 0) {
    (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
    return 0;
  }
  return iVar2;
}

Assistant:

static int pager_journal_rollback(Pager *pPager,int check_hot)
{
	int rc;
	if( check_hot ){
		int iExists = 0; /* cc warning */
		/* Check if the journal file exists */
		rc = pager_has_hot_journal(pPager,&iExists);
		if( rc != UNQLITE_OK  ){
			/* IO error */
			return rc;
		}
		if( !iExists ){
			/* Journal file does not exists */
			return UNQLITE_OK;
		}
	}
	if( pPager->is_rdonly ){
		unqliteGenErrorFormat(pPager->pDb,
			"Cannot rollback journal file '%s' due to a read-only database handle",pPager->zJournal);
		return UNQLITE_READ_ONLY;
	}
	/* Get an EXCLUSIVE lock on the database file. At this point it is
      ** important that a RESERVED lock is not obtained on the way to the
      ** EXCLUSIVE lock. If it were, another process might open the
      ** database file, detect the RESERVED lock, and conclude that the
      ** database is safe to read while this process is still rolling the 
      ** hot-journal back.
      ** 
      ** Because the intermediate RESERVED lock is not requested, any
      ** other process attempting to access the database file will get to 
      ** this point in the code and fail to obtain its own EXCLUSIVE lock 
      ** on the database file.
      **
      ** Unless the pager is in locking_mode=exclusive mode, the lock is
      ** downgraded to SHARED_LOCK before this function returns.
      */
	/* Open the journal file */
	rc = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,&pPager->pjfd,UNQLITE_OPEN_READWRITE);
	if( rc != UNQLITE_OK ){
		unqliteGenErrorFormat(pPager->pDb,"IO error while opening journal file: '%s'",pPager->zJournal);
		goto fail;
	}
	rc = pager_lock_db(pPager,EXCLUSIVE_LOCK);
	if( rc != UNQLITE_OK ){
		unqliteGenError(pPager->pDb,"Cannot acquire an exclusive lock on the database while journal rollback");
		goto fail;
	}
	/* Sync the journal file */
	unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
	/* Finally rollback the database */
	rc = pager_playback(pPager);
	/* Switch back to shared lock */
	pager_unlock_db(pPager,SHARED_LOCK);
fail:
	/* Close the journal handle */
	unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
	pPager->pjfd = 0;
	if( rc == UNQLITE_OK ){
		/* Delete the journal file */
		unqliteOsDelete(pPager->pVfs,pPager->zJournal,TRUE);
	}
	return rc;
}